

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttmtx.c
# Opt level: O3

FT_Error tt_face_load_hmtx(TT_Face face,FT_Stream stream,FT_Bool vertical)

{
  FT_Error FVar1;
  FT_ULong in_RAX;
  undefined7 in_register_00000011;
  FT_ULong FVar2;
  FT_ULong local_38;
  FT_ULong table_size;
  
  FVar2 = 0x766d7478;
  if ((int)CONCAT71(in_register_00000011,vertical) == 0) {
    FVar2 = 0x686d7478;
  }
  local_38 = in_RAX;
  FVar1 = (*face->goto_table)(face,FVar2,stream,&local_38);
  if (FVar1 == 0) {
    (&face->horz_metrics_size)[vertical != '\0'] = local_38;
    FVar2 = FT_Stream_Pos(stream);
    (&face->horz_metrics_offset)[vertical != '\0'] = FVar2;
  }
  return FVar1;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_hmtx( TT_Face    face,
                     FT_Stream  stream,
                     FT_Bool    vertical )
  {
    FT_Error   error;
    FT_ULong   tag, table_size;
    FT_ULong*  ptable_offset;
    FT_ULong*  ptable_size;


    if ( vertical )
    {
      tag           = TTAG_vmtx;
      ptable_offset = &face->vert_metrics_offset;
      ptable_size   = &face->vert_metrics_size;
    }
    else
    {
      tag           = TTAG_hmtx;
      ptable_offset = &face->horz_metrics_offset;
      ptable_size   = &face->horz_metrics_size;
    }

    error = face->goto_table( face, tag, stream, &table_size );
    if ( error )
      goto Fail;

    *ptable_size   = table_size;
    *ptable_offset = FT_STREAM_POS();

  Fail:
    return error;
  }